

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int VP8LGetInfo(uint8_t *data,size_t data_size,int *width,int *height,int *has_alpha)

{
  int iVar1;
  int a;
  int h;
  int w;
  VP8LBitReader br;
  int local_54;
  int local_50;
  int local_4c;
  VP8LBitReader local_48;
  
  iVar1 = 0;
  if (((4 < data_size && data != (uint8_t *)0x0) && (iVar1 = 0, *data == '/')) && (data[4] < 0x20))
  {
    VP8LInitBitReader(&local_48,data,data_size);
    iVar1 = ReadImageInfo(&local_48,&local_4c,&local_50,&local_54);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      if (width != (int *)0x0) {
        *width = local_4c;
      }
      if (height != (int *)0x0) {
        *height = local_50;
      }
      iVar1 = 1;
      if (has_alpha != (int *)0x0) {
        *has_alpha = local_54;
      }
    }
  }
  return iVar1;
}

Assistant:

int VP8LGetInfo(const uint8_t* data, size_t data_size,
                int* const width, int* const height, int* const has_alpha) {
  if (data == NULL || data_size < VP8L_FRAME_HEADER_SIZE) {
    return 0;         // not enough data
  } else if (!VP8LCheckSignature(data, data_size)) {
    return 0;         // bad signature
  } else {
    int w, h, a;
    VP8LBitReader br;
    VP8LInitBitReader(&br, data, data_size);
    if (!ReadImageInfo(&br, &w, &h, &a)) {
      return 0;
    }
    if (width != NULL) *width = w;
    if (height != NULL) *height = h;
    if (has_alpha != NULL) *has_alpha = a;
    return 1;
  }
}